

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::CheckPrivatelyLeakedFields(Parser *this,Definition *def,Definition *value_type)

{
  Value *pVVar1;
  Value *pVVar2;
  long in_RCX;
  allocator<char> local_41;
  string local_40;
  
  if (*(char *)((long)&def[8].name._M_dataplus._M_p + 7) != '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"private",&local_41);
    pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&value_type->attributes,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"private",&local_41);
    pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                       ((SymbolTable<flatbuffers::Value> *)(in_RCX + 0x58),&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if ((pVVar1 == (Value *)0x0) && (pVVar2 != (Value *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "Leaking private implementation, verify all objects have similar annotations",
                 &local_41);
      Error(this,&def->name);
      std::__cxx11::string::~string((string *)&local_40);
      goto LAB_00116458;
    }
  }
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_00116458:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::CheckPrivatelyLeakedFields(const Definition &def,
                                                const Definition &value_type) {
  if (!opts.no_leak_private_annotations) return NoError();
  const auto is_private = def.attributes.Lookup("private");
  const auto is_field_private = value_type.attributes.Lookup("private");
  if (!is_private && is_field_private) {
    return Error(
        "Leaking private implementation, verify all objects have similar "
        "annotations");
  }
  return NoError();
}